

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::variable_statement,std::vector<mjs::declaration,std::allocator<mjs::declaration>>>
          (parser *this,vector<mjs::declaration,_std::allocator<mjs::declaration>_> *args)

{
  variable_statement *this_00;
  list *in_RDX;
  source_extend local_40;
  undefined1 local_21;
  list *local_20;
  vector<mjs::declaration,_std::allocator<mjs::declaration>_> *args_local;
  parser *this_local;
  statement_ptr *s;
  
  args_local = args;
  this_local = this;
  if (args[4].super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::variable_statement, Args = <std::vector<mjs::declaration>>]"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  this_00 = (variable_statement *)operator_new(0x38);
  position_stack_node::extend
            (&local_40,
             (position_stack_node *)
             args[4].super__Vector_base<mjs::declaration,_std::allocator<mjs::declaration>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  variable_statement::variable_statement(this_00,&local_40,local_20);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_40);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }